

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

Var Js::JavascriptString::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  Var aValue;
  Var pvVar6;
  JavascriptSymbol *pJVar7;
  JavascriptStringObject *value;
  RecyclableObject *constructor;
  RecyclableObject *obj;
  int in_stack_00000010;
  Arguments local_50;
  undefined1 auStack_40 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x7d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d202a5;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  auStack_40 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)auStack_40,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)auStack_40 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x80,"(args.Info.Count > 0)","Negative argument count");
    if (!bVar3) {
LAB_00d202a5:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  aValue = CallInfo::GetNewTarget
                     ((uint)auStack_40._0_4_ >> 0x18,(Var *)args.super_Arguments.Info,
                      auStack_40._0_4_ & 0xffffff);
  local_50.Info = (Type)auStack_40;
  local_50.Values = (Type)args.super_Arguments.Info;
  bVar3 = JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_50);
  if (((ulong)auStack_40 & 0xfffffe) == 0) {
    value = (JavascriptStringObject *)
            JavascriptLibrary::GetEmptyString((pSVar1->super_ScriptContextBase).javascriptLibrary);
  }
  else {
    pvVar6 = Arguments::operator[]((Arguments *)auStack_40,1);
    bVar4 = VarIs<Js::JavascriptSymbol>(pvVar6);
    if (bVar4) {
      pJVar7 = UnsafeVarTo<Js::JavascriptSymbol>(pvVar6);
    }
    else {
      pJVar7 = (JavascriptSymbol *)0x0;
    }
    if ((pJVar7 == (JavascriptSymbol *)0x0) ||
       (((ulong)args.super_Arguments.Values & 0x1000000) != 0)) {
      pvVar6 = Arguments::operator[]((Arguments *)auStack_40,1);
      value = (JavascriptStringObject *)JavascriptConversion::ToString(pvVar6,pSVar1);
      bVar4 = true;
    }
    else {
      value = (JavascriptStringObject *)
              JavascriptSymbol::ToString
                        ((pJVar7->propertyRecordUsageCache).propertyRecord.ptr,pSVar1);
      bVar4 = false;
    }
    if (!bVar4) {
      return value;
    }
  }
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    value = JavascriptLibrary::CreateStringObject
                      ((pSVar1->super_ScriptContextBase).javascriptLibrary,(JavascriptString *)value
                      );
  }
  if (bVar3) {
    constructor = VarTo<Js::RecyclableObject>(aValue);
    obj = UnsafeVarTo<Js::RecyclableObject>(value);
    value = (JavascriptStringObject *)
            JavascriptOperators::OrdinaryCreateFromConstructor
                      (constructor,obj,(DynamicObject *)0x0,pSVar1);
  }
  return value;
}

Assistant:

Var JavascriptString::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        AssertMsg(args.Info.Count > 0, "Negative argument count");

        // SkipDefaultNewObject function flag should have prevented the default object from
        // being created, except when call true a host dispatch.
        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

        JavascriptString* str;
        Var result;

        if (args.Info.Count > 1)
        {
            JavascriptSymbol * symbol = JavascriptOperators::TryFromVar<JavascriptSymbol>(args[1]);
            if (symbol && !(callInfo.Flags & CallFlags_New))
            {
                // By ES2015 21.1.1.1 step 2, calling the String constructor directly results in an explicit ToString, which does not throw.
                return JavascriptSymbol::ToString(symbol->GetValue(), scriptContext);
                // Calling with new is an implicit ToString on the Symbol, resulting in a throw. For this case we can let JavascriptConversion handle the call.
            }
            str = JavascriptConversion::ToString(args[1], scriptContext);
        }
        else
        {
            str = scriptContext->GetLibrary()->GetEmptyString();
        }

        if (callInfo.Flags & CallFlags_New)
        {
            result = scriptContext->GetLibrary()->CreateStringObject(str);
        }
        else
        {
            result = str;
        }

        return isCtorSuperCall ?
            JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), UnsafeVarTo<RecyclableObject>(result), nullptr, scriptContext) :
            result;
    }